

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-internal-utils.cc
# Opt level: O2

string * testing::internal::JoinAsTuple(string *__return_storage_ptr__,Strings *fields)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  long lVar1;
  size_t i;
  ulong uVar2;
  allocator<char> local_29;
  
  __str = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)fields;
  lVar1 = *(long *)(fields + 8) - (long)__str >> 5;
  if (lVar1 == 1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,__str);
  }
  else if (lVar1 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_29);
  }
  else {
    std::operator+(__return_storage_ptr__,"(",__str);
    lVar1 = 0x20;
    for (uVar2 = 1; uVar2 < (ulong)(*(long *)(fields + 8) - *(long *)fields >> 5); uVar2 = uVar2 + 1
        ) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,", ");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (*(long *)fields + lVar1));
      lVar1 = lVar1 + 0x20;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,")");
  }
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ std::string JoinAsTuple(const Strings& fields) {
  switch (fields.size()) {
    case 0:
      return "";
    case 1:
      return fields[0];
    default:
      std::string result = "(" + fields[0];
      for (size_t i = 1; i < fields.size(); i++) {
        result += ", ";
        result += fields[i];
      }
      result += ")";
      return result;
  }
}